

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::handleLoopAttributes
          (TParseContext *this,TAttributes *attributes,TIntermNode *node)

{
  _List_node_base *this_00;
  _List_node_base *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar4;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar5;
  TConstUnion *pTVar6;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  long *plVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  _func_int **pp_Var11;
  undefined8 *puVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_15;
  
  iVar2 = (*node->_vptr_TIntermNode[0xe])(node);
  lVar8 = CONCAT44(extraout_var,iVar2);
  if (lVar8 == 0) {
    iVar2 = (*node->_vptr_TIntermNode[6])(node);
    plVar7 = (long *)CONCAT44(extraout_var_15,iVar2);
    if (plVar7 != (long *)0x0) {
      lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
      for (puVar12 = *(undefined8 **)(lVar8 + 8); lVar8 = (**(code **)(*plVar7 + 400))(plVar7),
          puVar12 != *(undefined8 **)(lVar8 + 0x10); puVar12 = puVar12 + 1) {
        lVar8 = (**(code **)(*(long *)*puVar12 + 0x70))();
        if (lVar8 != 0) goto LAB_0046c5c7;
      }
    }
  }
  else {
LAB_0046c5c7:
    for (p_Var1 = (attributes->
                  super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ).
                  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        (_List_node_header *)p_Var1 !=
        &(attributes->
         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
         ._M_impl._M_node; p_Var1 = p_Var1->_M_next) {
      if (*(int *)&p_Var1[1]._M_next - 0x12U < 0x10) {
        this_00 = p_Var1 + 1;
        switch(*(int *)&p_Var1[1]._M_next) {
        case 0x12:
          if ((p_Var1[1]._M_prev != (_List_node_base *)0x0) &&
             (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
             0 < (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3))) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar3 = CONCAT44(extraout_var_00,iVar2);
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "expected no arguments";
            pcVar9 = "unroll";
            goto LAB_0046cb01;
          }
          *(undefined1 *)(lVar8 + 0x39) = 1;
          break;
        case 0x13:
          if ((p_Var1[1]._M_prev != (_List_node_base *)0x0) &&
             (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
             0 < (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3))) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar3 = CONCAT44(extraout_var_03,iVar2);
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "expected no arguments";
            pcVar9 = "dont_unroll";
            goto LAB_0046cb01;
          }
          *(undefined1 *)(lVar8 + 0x3a) = 1;
          *(undefined8 *)(lVar8 + 0x4c) = 0;
          break;
        default:
          goto switchD_0046c613_caseD_14;
        case 0x1b:
          if ((p_Var1[1]._M_prev != (_List_node_base *)0x0) &&
             (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
             0 < (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3))) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar3 = CONCAT44(extraout_var_01,iVar2);
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "expected no arguments";
            pcVar9 = "dependency_infinite";
            goto LAB_0046cb01;
          }
          *(undefined4 *)(lVar8 + 0x3c) = 0xffffffff;
          break;
        case 0x1c:
          lVar5 = 0x170;
          if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
             (lVar4 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
             (*(long *)(lVar4 + 0x10) - *(long *)(lVar4 + 8) & 0x7fffffff8U) != 8)) {
            pcVar9 = "expected a single integer argument";
          }
          else {
            pTVar6 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0);
            pcVar9 = "expected a single integer argument";
            if (pTVar6 != (TConstUnion *)0x0) {
              if (0 < (pTVar6->field_0).iConst) {
                *(int *)(lVar8 + 0x3c) = (pTVar6->field_0).iConst;
                break;
              }
              lVar5 = 0x168;
              pcVar9 = "must be positive";
            }
          }
          iVar2 = (**node->_vptr_TIntermNode)(node);
          (**(code **)((long)(this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions + lVar5))
                    (this,iVar2,pcVar9,"dependency_length","");
          break;
        case 0x1d:
          if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,CONCAT44(extraout_var_06,iVar2),
                       "attribute requires a SPIR-V 1.4 target-env","min_iterations","");
          }
          if (((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
              (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
              (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) ||
             (pTVar6 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0),
             pTVar6 == (TConstUnion *)0x0)) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar3 = CONCAT44(extraout_var_12,iVar2);
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "expected a single integer argument";
            pcVar9 = "min_iterations";
            goto LAB_0046cb01;
          }
          *(int *)(lVar8 + 0x40) = (pTVar6->field_0).iConst;
          break;
        case 0x1e:
          if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,CONCAT44(extraout_var_02,iVar2),
                       "attribute requires a SPIR-V 1.4 target-env","max_iterations","");
          }
          if (((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
              (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
              (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) ||
             (pTVar6 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0),
             pTVar6 == (TConstUnion *)0x0)) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar3 = CONCAT44(extraout_var_09,iVar2);
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "expected a single integer argument";
            pcVar9 = "max_iterations";
            goto LAB_0046cb01;
          }
          *(int *)(lVar8 + 0x44) = (pTVar6->field_0).iConst;
          break;
        case 0x1f:
          if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,CONCAT44(extraout_var_04,iVar2),
                       "attribute requires a SPIR-V 1.4 target-env","iteration_multiple","");
          }
          if (((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
              (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
              (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) ||
             (pTVar6 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0),
             pTVar6 == (TConstUnion *)0x0)) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar3 = CONCAT44(extraout_var_10,iVar2);
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "expected a single integer argument";
            pcVar9 = "iteration_multiple";
            goto LAB_0046cb01;
          }
          if ((pTVar6->field_0).iConst == 0) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,CONCAT44(extraout_var_14,iVar2),"must be greater than or equal to 1",
                       "iteration_multiple","");
          }
          else {
            *(int *)(lVar8 + 0x48) = (pTVar6->field_0).iConst;
          }
          break;
        case 0x20:
          if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,CONCAT44(extraout_var_05,iVar2),
                       "attribute requires a SPIR-V 1.4 target-env","peel_count","");
          }
          if (((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
              (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
              (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) ||
             (pTVar6 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0),
             pTVar6 == (TConstUnion *)0x0)) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar3 = CONCAT44(extraout_var_11,iVar2);
            pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "expected a single integer argument";
            pcVar9 = "peel_count";
            goto LAB_0046cb01;
          }
          *(int *)(lVar8 + 0x4c) = (pTVar6->field_0).iConst;
LAB_0046ca22:
          *(undefined1 *)(lVar8 + 0x3a) = 0;
          break;
        case 0x21:
          if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,CONCAT44(extraout_var_07,iVar2),
                       "attribute requires a SPIR-V 1.4 target-env","partial_count","");
          }
          if (((p_Var1[1]._M_prev != (_List_node_base *)0x0) &&
              (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
              (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) == 8)) &&
             (pTVar6 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0),
             pTVar6 != (TConstUnion *)0x0)) {
            *(int *)(lVar8 + 0x50) = (pTVar6->field_0).iConst;
            goto LAB_0046ca22;
          }
          iVar2 = (**node->_vptr_TIntermNode)(node);
          uVar3 = CONCAT44(extraout_var_13,iVar2);
          pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "expected a single integer argument";
          pcVar9 = "partial_count";
          goto LAB_0046cb01;
        }
      }
      else {
switchD_0046c613_caseD_14:
        iVar2 = (**node->_vptr_TIntermNode)(node);
        uVar3 = CONCAT44(extraout_var_08,iVar2);
        pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar10 = "attribute does not apply to a loop";
        pcVar9 = "";
LAB_0046cb01:
        (*pp_Var11[0x2e])(this,uVar3,pcVar10,pcVar9,"");
      }
    }
  }
  return;
}

Assistant:

void TParseContext::handleLoopAttributes(const TAttributes& attributes, TIntermNode* node)
{
    TIntermLoop* loop = node->getAsLoopNode();
    if (loop == nullptr) {
        // the actual loop might be part of a sequence
        TIntermAggregate* agg = node->getAsAggregate();
        if (agg == nullptr)
            return;
        for (auto it = agg->getSequence().begin(); it != agg->getSequence().end(); ++it) {
            loop = (*it)->getAsLoopNode();
            if (loop != nullptr)
                break;
        }
        if (loop == nullptr)
            return;
    }

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {

        const auto noArgument = [&](const char* feature) {
            if (it->size() > 0) {
                warn(node->getLoc(), "expected no arguments", feature, "");
                return false;
            }
            return true;
        };

        const auto positiveSignedArgument = [&](const char* feature, int& value) {
            if (it->size() == 1 && it->getInt(value)) {
                if (value <= 0) {
                    error(node->getLoc(), "must be positive", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            return true;
        };

        const auto unsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (!(it->size() == 1 && it->getInt(value))) {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto positiveUnsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (it->size() == 1 && it->getInt(value)) {
                if (value == 0) {
                    error(node->getLoc(), "must be greater than or equal to 1", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto spirv14 = [&](const char* feature) {
            if (spvVersion.spv > 0 && spvVersion.spv < EShTargetSpv_1_4)
                warn(node->getLoc(), "attribute requires a SPIR-V 1.4 target-env", feature, "");
        };

        int value = 0;
        unsigned uiValue = 0;
        switch (it->name) {
        case EatUnroll:
            if (noArgument("unroll"))
                loop->setUnroll();
            break;
        case EatLoop:
            if (noArgument("dont_unroll"))
                loop->setDontUnroll();
            break;
        case EatDependencyInfinite:
            if (noArgument("dependency_infinite"))
                loop->setLoopDependency(TIntermLoop::dependencyInfinite);
            break;
        case EatDependencyLength:
            if (positiveSignedArgument("dependency_length", value))
                loop->setLoopDependency(value);
            break;
        case EatMinIterations:
            spirv14("min_iterations");
            if (unsignedArgument("min_iterations", uiValue))
                loop->setMinIterations(uiValue);
            break;
        case EatMaxIterations:
            spirv14("max_iterations");
            if (unsignedArgument("max_iterations", uiValue))
                loop->setMaxIterations(uiValue);
            break;
        case EatIterationMultiple:
            spirv14("iteration_multiple");
            if (positiveUnsignedArgument("iteration_multiple", uiValue))
                loop->setIterationMultiple(uiValue);
            break;
        case EatPeelCount:
            spirv14("peel_count");
            if (unsignedArgument("peel_count", uiValue))
                loop->setPeelCount(uiValue);
            break;
        case EatPartialCount:
            spirv14("partial_count");
            if (unsignedArgument("partial_count", uiValue))
                loop->setPartialCount(uiValue);
            break;
        default:
            warn(node->getLoc(), "attribute does not apply to a loop", "", "");
            break;
        }
    }
}